

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinDeserializer<std::unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
     ::deserialize_elems<InputStream>
               (undefined8 param_1,int param_2,
               unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
               *param_3)

{
  __enable_if_t<is_constructible<value_type,_pair<int,_char>_&&>::value,_pair<iterator,_bool>_>
  _Var1;
  T elem;
  _Node_iterator_base<std::pair<const_int,_char>,_false> in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  pair<int,_char> in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = param_2;
  while (local_14 != 0) {
    std::pair<int,_char>::pair<int,_char,_true>((pair<int,_char> *)&stack0xffffffffffffffd8);
    deserialize<std::pair<int,char>,InputStream>
              ((pair<int,_char> *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
               (InputStream *)in_stack_ffffffffffffffc8._M_cur);
    _Var1 = std::
            unordered_map<int,char,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,char>>>
            ::insert<std::pair<int,char>>(param_3,(pair<int,_char> *)in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffc8._M_cur =
         (__node_type *)
         _Var1.first.super__Node_iterator_base<std::pair<const_int,_char>,_false>._M_cur;
    in_stack_ffffffffffffffd0 = _Var1.second;
    local_14 = local_14 + -1;
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::true_type  /* has insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    // map value_type is pair<const K, V>, we need pair<K, V>
    using T = deep_remove_const_t<typename Sequence::value_type>;

    while (size--)
    {
      T elem;
      mserialize::deserialize(elem, istream);
      s.insert(std::move(elem));
    }
  }